

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ImmediatePromiseNode<kj::OwnFd>::destroy(ImmediatePromiseNode<kj::OwnFd> *this)

{
  ImmediatePromiseNode<kj::OwnFd> *this_local;
  
  freePromise<kj::_::ImmediatePromiseNode<kj::OwnFd>>(this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }